

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O1

int ON_FindLocalMinimum(_func_int_void_ptr_double_double_ptr_double_ptr *f,void *farg,double ax,
                       double bx,double cx,double rel_stepsize_tol,double abs_stepsize_tol,
                       int max_it,double *t_addr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *sFormat;
  ulong uVar7;
  ulong in_XMM0_Qb;
  double dVar8;
  ulong in_XMM1_Qb;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ulong uVar14;
  double dVar15;
  ulong uVar16;
  double dVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double fx;
  double dx;
  double fu;
  double du;
  double local_f8;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  double local_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  if (t_addr == (double *)0x0) {
    sFormat = "t_addr is nullptr";
    iVar6 = 0x4d;
  }
  else {
    *t_addr = bx;
    if (max_it < 2) {
      sFormat = "max_it must be >= 2";
      iVar6 = 0x55;
    }
    else {
      local_c8 = rel_stepsize_tol;
      local_a8 = bx;
      uStack_a0 = in_XMM1_Qb;
      local_88 = ax;
      uStack_80 = in_XMM0_Qb;
      bVar5 = ON_IsValid(rel_stepsize_tol);
      if (((1.0 <= local_c8) || (local_c8 <= 0.0)) || (!bVar5)) {
        sFormat = "rel_stepsize_tol must be strictly between 0.0 and 1.0";
        iVar6 = 0x5a;
      }
      else {
        bVar5 = ON_IsValid(abs_stepsize_tol);
        if (0.0 < abs_stepsize_tol && bVar5) {
          iVar6 = (*f)(farg,local_a8,&local_e8,&local_e0);
          if (iVar6 != 0) {
            if (iVar6 < 0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0x6a,"","ON_FindLocalMinimum() f() failed to evaluate.");
            }
            *t_addr = local_a8;
LAB_00567eec:
            return (uint)(0 < iVar6);
          }
          dVar15 = local_88;
          if (local_88 <= cx) {
            dVar15 = cx;
          }
          dVar13 = local_88;
          if (cx <= local_88) {
            dVar13 = cx;
          }
          local_f8 = local_a8;
          local_68 = 0.0;
          uStack_60 = 0;
          local_d8 = local_e8;
          local_b8 = 0.0;
          local_d0 = local_e0;
          dVar12 = local_e0;
          uVar14 = uStack_80;
          dVar17 = local_a8;
          uVar18 = uStack_a0;
          dVar19 = local_e8;
          dVar9 = local_a8;
          uVar16 = uStack_80;
          do {
            dVar8 = (dVar15 + dVar13) * 0.5;
            uStack_50 = uVar18 & 0x7fffffffffffffff;
            dVar20 = ABS(dVar17) * local_c8 + abs_stepsize_tol;
            dVar10 = dVar20 + dVar20;
            dVar11 = dVar15 - dVar13;
            if (ABS(dVar17 - dVar8) <= dVar11 * -0.5 + dVar10) {
              *t_addr = dVar17;
              return 1;
            }
            uVar7 = uVar14;
            uStack_b0 = uVar14;
            if (ABS(local_b8) <= dVar20) {
LAB_005681c9:
              local_b8 = (double)(~-(ulong)(local_e0 < 0.0) & (ulong)dVar13 |
                                 -(ulong)(local_e0 < 0.0) & (ulong)dVar15) - dVar17;
              local_58 = local_b8 * 0.5;
            }
            else {
              local_58 = (double)(~-(ulong)(dVar12 != local_e0) & (ulong)(dVar11 + dVar11) |
                                 (ulong)(((local_f8 - dVar17) * local_e0) / (local_e0 - dVar12)) &
                                 -(ulong)(dVar12 != local_e0));
              dVar11 = (double)(~-(ulong)(local_d0 != local_e0) & (ulong)(dVar11 + dVar11) |
                               (ulong)(((dVar9 - dVar17) * local_e0) / (local_e0 - local_d0)) &
                               -(ulong)(local_d0 != local_e0));
              bVar5 = 0.0 < ((dVar17 + local_58) - dVar15) * (dVar13 - (dVar17 + local_58));
              bVar2 = local_e0 * local_58 <= 0.0;
              bVar4 = bVar2 && bVar5;
              bVar1 = 0.0 < ((dVar17 + dVar11) - dVar15) * (dVar13 - (dVar17 + dVar11));
              bVar3 = local_e0 * dVar11 <= 0.0;
              if ((bVar4) || (bVar3 && bVar1)) {
                if ((bVar3 && bVar1) && (bVar2 && bVar5)) {
                  bVar4 = ABS(local_58) < ABS(dVar11);
                }
                if (!bVar4) {
                  local_58 = dVar11;
                }
                if (ABS(local_b8 * 0.5) < ABS(local_58)) goto LAB_005681c9;
                if (((dVar17 + local_58) - dVar13 < dVar10) ||
                   (uVar7 = uVar16, dVar15 - (dVar17 + local_58) < dVar10)) {
                  uVar7 = -(ulong)(dVar17 <= dVar8);
                  local_58 = (double)(~uVar7 & (ulong)-dVar20 | uVar7 & (ulong)dVar20);
                  uVar7 = ~uVar18 & (uStack_50 ^ 0x8000000000000000) | uVar18 & uStack_50;
                }
                uStack_b0 = uStack_60;
                local_b8 = local_68;
              }
              else {
                local_b8 = (double)(~-(ulong)(local_e0 < 0.0) & (ulong)dVar13 |
                                   -(ulong)(local_e0 < 0.0) & (ulong)dVar15) - dVar17;
                local_58 = local_b8 * 0.5;
              }
            }
            local_a8 = dVar17;
            uStack_a0 = uVar18;
            local_98 = dVar19;
            local_88 = dVar13;
            uStack_80 = uVar14;
            local_78 = dVar9;
            local_70 = dVar12;
            local_68 = local_58;
            uStack_60 = uVar7;
            local_48 = dVar15;
            uStack_40 = uVar16;
            if (dVar20 <= ABS(local_58)) {
              local_58 = dVar17 + local_58;
              uStack_50 = uVar18;
              iVar6 = (*f)(farg,local_58,&local_c0,&local_90);
            }
            else {
              local_58 = (double)(~-(ulong)(local_58 < 0.0) & (ulong)dVar20 |
                                 (ulong)-dVar20 & -(ulong)(local_58 < 0.0)) + dVar17;
              iVar6 = (*f)(farg,local_58,&local_c0,&local_90);
              if ((-1 < iVar6) && (local_e8 < local_c0)) {
                *t_addr = local_a8;
                return 1;
              }
            }
            dVar12 = local_e0;
            dVar19 = local_e8;
            if (iVar6 != 0) {
              if (iVar6 < 0) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                           ,0xa9,"","ON_FindLocalMinimum() f() failed to evaluate.");
              }
              else {
                *t_addr = (double)(~-(ulong)(local_c0 < local_e8) & (ulong)local_a8 |
                                  (ulong)local_58 & -(ulong)(local_c0 < local_e8));
              }
              goto LAB_00567eec;
            }
            dVar9 = local_f8;
            if (local_c0 <= local_e8) {
              dVar13 = local_88;
              uVar14 = uStack_80;
              if (local_a8 <= local_58) {
                dVar13 = local_a8;
                uVar14 = uStack_a0;
              }
              dVar15 = (double)(~-(ulong)(local_58 < local_a8) & (ulong)local_48 |
                               -(ulong)(local_58 < local_a8) & (ulong)local_a8);
              uVar16 = ~uStack_a0 & uStack_40 | uStack_a0;
              local_d0 = local_70;
              local_e8 = local_c0;
              local_e0 = local_90;
              local_d8 = local_98;
              local_f8 = local_a8;
              dVar17 = local_58;
              uVar18 = uStack_50;
            }
            else {
              dVar13 = local_58;
              uVar14 = uStack_50;
              if (local_a8 <= local_58) {
                dVar13 = local_88;
                uVar14 = uStack_80;
              }
              uVar16 = uStack_40 & uStack_50;
              dVar15 = (double)((ulong)local_48 & -(ulong)(local_58 < local_a8) |
                               ~-(ulong)(local_58 < local_a8) & (ulong)local_58);
              dVar17 = local_a8;
              uVar18 = uStack_a0;
              if (local_98 < local_c0) {
                if ((local_f8 != local_a8) || (NAN(local_f8) || NAN(local_a8))) {
                  dVar19 = local_98;
                  dVar12 = local_70;
                  if (local_d8 <= local_c0) {
                    if (((local_78 != local_a8) || (NAN(local_78) || NAN(local_a8))) &&
                       ((dVar9 = local_78, local_78 != local_f8 || (NAN(local_78) || NAN(local_f8)))
                       )) goto LAB_005684d1;
                  }
                  local_d0 = local_90;
                  local_d8 = local_c0;
                  dVar9 = local_58;
                  goto LAB_005684d1;
                }
              }
              local_d0 = local_70;
              local_d8 = local_98;
              local_f8 = local_58;
              dVar12 = local_90;
              dVar19 = local_c0;
            }
LAB_005684d1:
            max_it = max_it + -1;
            if (max_it == 0) {
              *t_addr = dVar17;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0xc0,"","ON_FindLocalMinimum() failed to converge");
              return 2;
            }
          } while( true );
        }
        sFormat = "abs_stepsize_tol must be > 0";
        iVar6 = 0x5f;
      }
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
             ,iVar6,"",sFormat);
  return 0;
}

Assistant:

int ON_FindLocalMinimum(
                int (*f)(void*,double,double*,double*), void* farg,
                double ax, double bx, double cx,
                double rel_stepsize_tol, double abs_stepsize_tol, int max_it, 
                double *t_addr
                )
/* Use Brent's algorithm (with derivative) to Find a (local) minimum of a function
 *
 * INPUT:
 *   ax, bx, cx a bracketed minimum satisfying conditions 1 and 2.
 *      1) either ax < bx < cx or cx < bx < ax.
 *      2) f(bx) < f(ax) and f(bx) < f(ax).
 *   farg
 *      pointer passed to function f()
 *   f
 *      evaluation function with prototype
 *              int f(void* farg,double t,double* ft,double* dft)
 *      f(farg,t,&ft,&dft) should compute ft = value of function at t
 *      and dft = value of derivative at t.
 *      -1: failure
 *       0: success
 *       1: |f(x)| is small enough - TL_NRdbrent() will return *t_addr = x
 *          and the return code 1.
 *   rel_stepsize_tol, abs_stepsize_tol  (0 < rel_stepsize_tol < 1 and 0 < abs_stepsize_tol)
 *      rel_stepsize_tol is a fractional tolerance and abs_stepsize_tol is an absolute tolerance
 *      that determine the minimum step size for a given iteration.
 *        minimum delta t = rel_stepsize_tol*|t| + abs_stepsize_tol.
 *      When in doubt, use 
 *         rel_stepsize_tol = ON_EPSILON 
 *         abs_stepsize_tol = 1/2*(desired absolute precision for *t_addr).
 *   max_it ( >= 2)
 *      maximum number of iterations to permit (when in doubt use 100)
 *      Closest Point to bezier minimizations typically take < 30
 *      iterations.
 *
 * OUTPUT:
 *   *t_addr abcissa of a local minimum between ax and cx.
 *       0: failure
 *       1: success
 *       2: After max_iteration_cnt iterations the tolerance restrictions
 *          where not satisfied.  Try increasing max_it, rel_stepsize_tol and/or abs_stepsize_tol
 *          or use the value of (*t_addr) with extreme caution.
 */
{
  // See Numerical Recipes in C's dbrent() for a description of the basic algorithm
  int rc,ok1,ok2;
  double a,b,d,d1,d2,du,dv,dw,dx,e,fu,fv,fw,fx,olde,tol1,tol2,u,u1,u2,v,w,x,xm;

  d=e=0.0;

  if ( 0 == t_addr )
  {
    ON_ERROR("t_addr is nullptr");
    return 0;
  }

  *t_addr = bx;

  if ( max_it < 2 )
  {
    ON_ERROR("max_it must be >= 2");
    return 0;
  }
  if ( !ON_IsValid(rel_stepsize_tol) || rel_stepsize_tol <= 0.0 || rel_stepsize_tol >= 1.0 )
  {
    ON_ERROR("rel_stepsize_tol must be strictly between 0.0 and 1.0");
    return 0;
  }
  if ( !ON_IsValid(abs_stepsize_tol) || abs_stepsize_tol <= 0.0 )
  {
    ON_ERROR("abs_stepsize_tol must be > 0");
    return 0;
  }

  a=(ax < cx ? ax : cx);
  b=(ax > cx ? ax : cx);
  x=w=v=bx;
  rc = f(farg,x,&fx,&dx);
  if (rc) {
     // f() returned nonzero return code which means we need to bailout
    if ( rc < 0 ) {
      ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
    }
    *t_addr = x;
    return rc>0 ? 1 : 0; // return 1 means f() said result is good enough, return = 0 means f() failed
  }
  fw=fv=fx;
  dw=dv=dx;
  while(max_it--) {
    xm=0.5*(a+b);
    tol1=rel_stepsize_tol*fabs(x)+abs_stepsize_tol;
    tol2=2.0*tol1;
    if (fabs(x-xm) <= (tol2-0.5*(b-a))) {
      // further adjustments to x are smaller than stepsize tolerance
      *t_addr=x;
      return 1;
    }
    if (fabs(e) > tol1) {
      d1=2.0*(b-a);
      d2=d1;
      if (dw != dx) d1=(w-x)*dx/(dx-dw);
      if (dv != dx) d2=(v-x)*dx/(dx-dv);
      u1=x+d1;
      u2=x+d2;
      ok1 = (a-u1)*(u1-b) > 0.0 && dx*d1 <= 0.0;
      ok2 = (a-u2)*(u2-b) > 0.0 && dx*d2 <= 0.0;
      olde=e;
      e=d;
      if (ok1 || ok2) {
        if (ok1 && ok2)
          d=(fabs(d1) < fabs(d2) ? d1 : d2);
        else if (ok1)
          d=d1;
        else
          d=d2;
        if (fabs(d) <= fabs(0.5*olde)) {
          u=x+d;
          if (u-a < tol2 || b-u < tol2)
            {d = (xm >= x) ? tol1 : -tol1;}
        } else {
          d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
        }
      } else {
        d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
      }
    } else {
      d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
    }
    if (fabs(d) >= tol1) {
      u=x+d;
      rc = f(farg,u,&fu,&du);
    }
    else {
      u = (d >= 0.0) ? x+tol1 : x-tol1;
      rc = f(farg,u,&fu,&du);
      if (rc >= 0 && fu > fx) {
        // tweaking x any more increases function value - x is a numerical minimum
        *t_addr=x;
        return 1;
      }
    }
    if (rc) {
      // f() returned nonzero return code which means we need to bailout
      if ( rc < 0 ) {
        ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
      }
      else {
        *t_addr = (fu < fx) ? u : x;
      }
      return rc>0 ? 1 : 0;
    }
    if (fu <= fx) {
      if (u >= x) a=x; else b=x;
      v=w;fv=fw;dv=dw;
      w=x;fw=fx;dw=dx;
      x=u;fx=fu;dx=du;
    } else {
      if (u < x) a=u; else b=u;
      if (fu <= fw || w == x) {
        v=w;fv=fw;dv=dw;
        w=u;fw=fu;dw=du;
      } else if (fu < fv || v == x || v == w) {
        v=u;fv=fu;dv=du;
      }
    }
  }
  *t_addr = x; // best known answer
  ON_ERROR("ON_FindLocalMinimum() failed to converge");
  return 2; // 2 means we failed to converge
}